

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiWindow ** __thiscall
ImVector<ImGuiWindow_*>::insert(ImVector<ImGuiWindow_*> *this,ImGuiWindow **it,ImGuiWindow **v)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow **__dest;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar6 = (long)it - (long)this->Data;
  iVar2 = this->Capacity;
  if (this->Size == iVar2) {
    iVar7 = this->Size + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar4) {
      iVar7 = iVar4;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar7 << 3,GImAllocatorUserData);
      if (this->Data != (ImGuiWindow **)0x0) {
        memcpy(__dest,this->Data,(long)this->Size << 3);
        ppIVar3 = this->Data;
        if ((ppIVar3 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      this->Data = __dest;
      this->Capacity = iVar7;
    }
  }
  lVar5 = (long)this->Size - (lVar6 >> 3);
  if (lVar5 != 0 && lVar6 >> 3 <= (long)this->Size) {
    memmove((void *)((long)this->Data + lVar6 + 8),(void *)((long)this->Data + lVar6),lVar5 * 8);
  }
  *(ImGuiWindow **)((long)this->Data + lVar6) = *v;
  this->Size = this->Size + 1;
  return (ImGuiWindow **)(lVar6 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }